

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O1

int Abc_MfsNodeDeref_rec(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  Abc_Obj_t *pNode_00;
  uint uVar2;
  int iVar3;
  int in_EDX;
  int iVar4;
  long lVar5;
  
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  iVar4 = 0;
  if ((uVar2 != 2) && (iVar4 = 0, uVar2 != 5)) {
    pAVar1 = pNode->pNtk;
    iVar4 = pAVar1->nTravIds;
    iVar3 = pNode->Id;
    Vec_IntFillExtra(&pAVar1->vTravIds,iVar3 + 1,in_EDX);
    if (((long)iVar3 < 0) || ((pAVar1->vTravIds).nSize <= iVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar1->vTravIds).pArray[iVar3] = iVar4;
    if ((pNode->vFanins).nSize < 1) {
      iVar4 = 1;
    }
    else {
      iVar4 = 1;
      lVar5 = 0;
      do {
        pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]];
        iVar3 = (pNode_00->vFanouts).nSize;
        if (iVar3 < 1) {
          __assert_fail("pFanin->vFanouts.nSize > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsDiv.c"
                        ,0x7f,"int Abc_MfsNodeDeref_rec(Abc_Obj_t *)");
        }
        iVar3 = iVar3 + -1;
        (pNode_00->vFanouts).nSize = iVar3;
        if (iVar3 == 0) {
          iVar3 = Abc_MfsNodeDeref_rec(pNode_00);
          iVar4 = iVar4 + iVar3;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (pNode->vFanins).nSize);
    }
  }
  return iVar4;
}

Assistant:

int Abc_MfsNodeDeref_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i, Counter = 1;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    Abc_NodeSetTravIdCurrent( pNode );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        assert( pFanin->vFanouts.nSize > 0 );
        if ( --pFanin->vFanouts.nSize == 0 )
            Counter += Abc_MfsNodeDeref_rec( pFanin );
    }
    return Counter;
}